

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethread_test.cc
# Opt level: O2

void __thiscall
anon_unknown.dwarf_5e07f8::AVxEncoderThreadTest::~AVxEncoderThreadTest(AVxEncoderThreadTest *this)

{
  (this->super_CodecTestWith5Params<libaom_test::TestMode,_int,_int,_int,_int>).
  super_TestWithParam<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int,_int,_int,_int>_>
  .super_Test._vptr_Test = (_func_int **)&PTR__AVxEncoderThreadTest_00ef8370;
  (this->super_CodecTestWith5Params<libaom_test::TestMode,_int,_int,_int,_int>).
  super_TestWithParam<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int,_int,_int,_int>_>
  .
  super_WithParamInterface<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int,_int,_int,_int>_>
  ._vptr_WithParamInterface = (_func_int **)&PTR__AVxEncoderThreadTest_00ef83d8;
  (this->super_EncoderTest)._vptr_EncoderTest = (_func_int **)&PTR__AVxEncoderThreadTest_00ef83f8;
  if (this->decoder_ != (Decoder *)0x0) {
    (*this->decoder_->_vptr_Decoder[1])();
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->md5_dec_);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->md5_enc_);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&(this->size_enc_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  libaom_test::EncoderTest::~EncoderTest(&this->super_EncoderTest);
  libaom_test::CodecTestWith3Params<libaom_test::TestMode,(anonymous_namespace)::TestVideoParam,int>
  ::~CodecTestWith3Params
            ((CodecTestWith3Params<libaom_test::TestMode,(anonymous_namespace)::TestVideoParam,int>
              *)this);
  return;
}

Assistant:

~AVxEncoderThreadTest() override { delete decoder_; }